

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::Read(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  double *p;
  uint uVar5;
  int iVar6;
  int iVar7;
  int cv_count1;
  int cv_count0;
  int order1;
  int order0;
  int is_rat;
  int dim;
  int reserved2;
  int reserved1;
  int major_version;
  int minor_version;
  ON_BoundingBox bbox;
  ON__INT32 local_88;
  ON__INT32 local_84;
  ON__INT32 local_80;
  ON__INT32 local_7c;
  ON__INT32 local_78;
  ON__INT32 local_74 [3];
  int local_68 [2];
  ON_BoundingBox local_60;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  local_68[0] = 0;
  local_68[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_68,local_68 + 1);
  if ((!bVar1) || (local_68[0] != 1)) {
    if (bVar1) {
      return true;
    }
    goto LAB_0054426f;
  }
  local_74[0] = 0;
  local_78 = 0;
  local_7c = 0;
  local_80 = 0;
  local_84 = 0;
  local_88 = 0;
  local_74[2] = 0;
  local_74[1] = 0;
  bVar1 = ON_BinaryArchive::ReadInt(file,local_74);
  if (((((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(file,&local_78), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,&local_7c), bVar1)) &&
      ((bVar1 = ON_BinaryArchive::ReadInt(file,&local_80), bVar1 &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,&local_84), bVar1)))) &&
     ((bVar1 = ON_BinaryArchive::ReadInt(file,&local_88), bVar1 &&
      ((bVar1 = ON_BinaryArchive::ReadInt(file,local_74 + 2), bVar1 &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,local_74 + 1), bVar1)))))) {
    ON_BoundingBox::ON_BoundingBox(&local_60);
    bVar1 = ON_BinaryArchive::ReadBoundingBox(file,&local_60);
    Create(this,local_74[0],local_78 != 0,local_7c,local_80,local_84,local_88);
    local_60.m_min.x._0_4_ = 0;
    if (((!bVar1) ||
        (bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_60),
        local_60.m_min.x._0_4_ < 0 || !bVar1)) ||
       (bVar1 = ReserveKnotCapacity(this,0,local_60.m_min.x._0_4_), !bVar1)) goto LAB_005441bc;
    bVar1 = ON_BinaryArchive::ReadDouble(file,(long)local_60.m_min.x._0_4_,this->m_knot[0]);
    local_60.m_min.x._0_4_ = 0;
    if (((!bVar1) ||
        (bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_60),
        local_60.m_min.x._0_4_ < 0 || !bVar1)) ||
       (bVar1 = ReserveKnotCapacity(this,1,local_60.m_min.x._0_4_), !bVar1)) goto LAB_005441bc;
    bVar2 = ON_BinaryArchive::ReadDouble(file,(long)local_60.m_min.x._0_4_,this->m_knot[1]);
    local_60.m_min.x._0_4_ = 0;
    bVar1 = false;
    if (bVar2) {
      bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_60);
    }
  }
  else {
    Create(this,local_74[0],local_78 != 0,local_7c,local_80,local_84,local_88);
LAB_005441bc:
    local_60.m_min.x._0_4_ = 0;
    bVar1 = false;
  }
  uVar5 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
  if ((bVar1 & -1 < local_60.m_min.x._0_4_) != 0) {
    bVar1 = ReserveCVCapacity(this,local_60.m_min.x._0_4_ * uVar5);
    if (((bVar1) && (0 < (int)uVar5)) && (0 < local_60.m_min.x._0_4_)) {
      iVar7 = this->m_cv_count[0];
      if (iVar7 < 1) {
        return true;
      }
      iVar4 = this->m_cv_count[1];
      iVar6 = 0;
      do {
        if ((0 < iVar4) && (bVar1 != false)) {
          iVar7 = 1;
          do {
            uVar3 = (iVar7 + -1) * this->m_cv_stride[1] + this->m_cv_stride[0] * iVar6;
            p = this->m_cv + uVar3;
            if ((int)uVar3 < 0) {
              p = (double *)0x0;
            }
            if (this->m_cv == (double *)0x0) {
              p = (double *)0x0;
            }
            bVar1 = ON_BinaryArchive::ReadDouble(file,(ulong)uVar5,p);
            iVar4 = this->m_cv_count[1];
          } while ((iVar7 < iVar4) && (iVar7 = iVar7 + 1, bVar1));
          iVar7 = this->m_cv_count[0];
        }
        iVar6 = iVar6 + 1;
      } while ((iVar6 < iVar7) && (bVar1 != false));
    }
    if (bVar1 != false) {
      return true;
    }
  }
LAB_0054426f:
  Destroy(this);
  return false;
}

Assistant:

bool ON_NurbsSurface::Read(
       ON_BinaryArchive&  file // open binary file
     )
{
  DestroySurfaceTree();
  // NOTE - check legacy I/O code if changed
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) {
    // common to all 1.x versions
    int dim = 0, is_rat = 0, order0 = 0, order1 = 0, cv_count0 = 0, cv_count1 = 0;
    int reserved1 = 0, reserved2 = 0;
    if (rc) rc = file.ReadInt( &dim );
    if (rc) rc = file.ReadInt( &is_rat );
    if (rc) rc = file.ReadInt( &order0 );
    if (rc) rc = file.ReadInt( &order1 );
    if (rc) rc = file.ReadInt( &cv_count0 );
    if (rc) rc = file.ReadInt( &cv_count1 );

    if (rc) rc = file.ReadInt(&reserved1);
    if (rc) rc = file.ReadInt(&reserved2);

    if (rc) {
      ON_BoundingBox bbox; // read bounding box - may be used in future
      rc = file.ReadBoundingBox(bbox);
    }
    
    Create( dim, is_rat, order0, order1, cv_count0, cv_count1 );

    int count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(0,count);
    if (rc) rc = file.ReadDouble( count, m_knot[0] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(1,count);
    if (rc) rc = file.ReadDouble( count, m_knot[1] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    const int cv_size = CVSize();
    if (rc) rc = ReserveCVCapacity( count*cv_size );
    if (count > 0 && cv_size > 0 && rc ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.ReadDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  if ( !rc )
    Destroy();
  return rc;
}